

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O0

void __thiscall MuxerManager::parseMuxOpt(MuxerManager *this,string *opts)

{
  char cVar1;
  bool bVar2;
  int32_t iVar3;
  char *pcVar4;
  reference pvVar5;
  size_type sVar6;
  long lVar7;
  longlong lVar8;
  reference pcVar9;
  int64_t iVar10;
  double dVar11;
  string local_120 [8];
  string prefix;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_d8;
  char j;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  string postfix;
  int64_t coeff;
  string local_88;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paramPair;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  string *opts_local;
  MuxerManager *this_local;
  
  params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = opts;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  splitQuotedStr_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,pcVar4,' ');
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&i);
    if (!bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      return;
    }
    paramPair.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    trimStr(&local_88,
            paramPair.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    splitStr_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_68,pcVar4,'=');
    std::__cxx11::string::~string((string *)&local_88);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
    if (!bVar2) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_68,0);
      bVar2 = std::operator==(pvVar5,"--start-time");
      if ((bVar2) &&
         (sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_68), 1 < sVar6)) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_68,1);
        lVar7 = std::__cxx11::string::find((char *)pvVar5,0x3b39b6);
        if (lVar7 == -1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_68,1);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          iVar10 = strToInt64(pcVar4);
          this->m_ptsOffset = iVar10 << 1;
        }
        else {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_68,1);
          dVar11 = timeToFloat(pvVar5);
          lVar8 = llround(dVar11 * 90000.0);
          this->m_ptsOffset = lVar8;
        }
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_68,0);
        bVar2 = std::operator==(pvVar5,"--no-asyncio");
        if (bVar2) {
          setAsyncMode(this,false);
        }
        else {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_68,0);
          bVar2 = std::operator==(pvVar5,"--cut-start");
          if (!bVar2) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_68,0);
            bVar2 = std::operator==(pvVar5,"--cut-end");
            if (!bVar2) {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_68,0);
              bVar2 = std::operator==(pvVar5,"--split-duration");
              if (!bVar2) {
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_68,0);
                bVar2 = std::operator==(pvVar5,"--split-size");
                if (!bVar2) {
                  pvVar5 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_68,0);
                  bVar2 = std::operator==(pvVar5,"--extra-iso-space");
                  if (bVar2) {
                    pvVar5 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)local_68,1);
                    iVar3 = strToInt32(pvVar5);
                    this->m_extraIsoBlocks = iVar3;
                  }
                  else {
                    pvVar5 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)local_68,0);
                    bVar2 = std::operator==(pvVar5,"--blu-ray");
                    if (!bVar2) {
                      pvVar5 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)local_68,0);
                      bVar2 = std::operator==(pvVar5,"--blu-ray-v3");
                      if (!bVar2) {
                        pvVar5 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)local_68,0);
                        bVar2 = std::operator==(pvVar5,"--avchd");
                        if (!bVar2) {
                          pvVar5 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)local_68,0);
                          bVar2 = std::operator==(pvVar5,"--demux");
                          if (bVar2) {
                            this->m_demuxMode = true;
                          }
                          else {
                            pvVar5 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_68,0);
                            bVar2 = std::operator==(pvVar5,"--constant-iso-hdr");
                            if (bVar2) {
                              this->m_reproducibleIsoHeader = true;
                            }
                          }
                          goto LAB_0031b627;
                        }
                      }
                    }
                    this->m_bluRayMode = true;
                  }
                  goto LAB_0031b627;
                }
              }
              if (this->m_extraIsoBlocks == 0) {
                this->m_extraIsoBlocks = 4;
              }
              goto LAB_0031b627;
            }
          }
          postfix.field_2._8_8_ = 1;
          std::__cxx11::string::string((string *)&__range5);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_68,1);
          __end5._M_current = (char *)std::__cxx11::string::begin();
          _Stack_d8._M_current = (char *)std::__cxx11::string::end();
          while (bVar2 = __gnu_cxx::operator!=(&__end5,&stack0xffffffffffffff28), bVar2) {
            pcVar9 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end5);
            cVar1 = *pcVar9;
            if (((cVar1 < '0') || ('9' < cVar1)) && (cVar1 != '.')) {
              std::__cxx11::string::operator+=((string *)&__range5,cVar1);
            }
            __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&__end5);
          }
          strToUpperCase((string *)((long)&prefix.field_2 + 8),(string *)&__range5);
          std::__cxx11::string::operator=
                    ((string *)&__range5,(string *)(prefix.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&__range5,"MS");
          if (bVar2) {
            postfix.field_2._8_8_ = 0x50bfe0;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&__range5,"S");
            if (bVar2) {
              postfix.field_2._8_8_ = 0x13b6d8300;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&__range5,"MIN");
              if (bVar2) {
                postfix.field_2._8_8_ = 0x49edaab400;
              }
            }
          }
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_68,1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_68,1);
          std::__cxx11::string::size();
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_120,(ulong)pvVar5);
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_68,0);
          bVar2 = std::operator==(pvVar5,"--cut-start");
          if (bVar2) {
            pcVar4 = (char *)std::__cxx11::string::c_str();
            iVar10 = strToInt64(pcVar4);
            setCutStart(this,iVar10 * postfix.field_2._8_8_);
          }
          else {
            pcVar4 = (char *)std::__cxx11::string::c_str();
            iVar10 = strToInt64(pcVar4);
            setCutEnd(this,iVar10 * postfix.field_2._8_8_);
          }
          std::__cxx11::string::~string(local_120);
          std::__cxx11::string::~string((string *)&__range5);
        }
      }
    }
LAB_0031b627:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void MuxerManager::parseMuxOpt(const string& opts)
{
    const vector<string> params = splitQuotedStr(opts.c_str(), ' ');
    for (auto& i : params)
    {
        vector<string> paramPair = splitStr(trimStr(i).c_str(), '=');
        if (paramPair.empty())
            continue;

        if (paramPair[0] == "--start-time" && paramPair.size() > 1)
        {
            if (paramPair[1].find(":") != string::npos)
                m_ptsOffset = llround(timeToFloat(paramPair[1]) * 90000.0);
            else
                m_ptsOffset = strToInt64(paramPair[1].c_str()) * 2;  // source in a 45Khz clock
        }
        else if (paramPair[0] == "--no-asyncio")
            setAsyncMode(false);
        else if (paramPair[0] == "--cut-start" || paramPair[0] == "--cut-end")
        {
            int64_t coeff = 1;
            string postfix;
            for (const auto j : paramPair[1])
            {
                if (!((j >= '0' && j <= '9') || j == '.'))
                    postfix += j;
            }

            postfix = strToUpperCase(postfix);

            if (postfix == "MS")
                coeff = INTERNAL_PTS_FREQ / 1000;
            else if (postfix == "S")
                coeff = INTERNAL_PTS_FREQ;
            else if (postfix == "MIN")
                coeff = 60 * INTERNAL_PTS_FREQ;
            string prefix = paramPair[1].substr(0, paramPair[1].size() - postfix.size());
            if (paramPair[0] == "--cut-start")
                setCutStart(strToInt64(prefix.c_str()) * coeff);
            else
                setCutEnd(strToInt64(prefix.c_str()) * coeff);
        }
        else if (paramPair[0] == "--split-duration" || paramPair[0] == "--split-size")
        {
            if (m_extraIsoBlocks == 0)
                m_extraIsoBlocks = 4;
        }
        else if (paramPair[0] == "--extra-iso-space")
        {
            m_extraIsoBlocks = strToInt32(paramPair[1]);
        }
        else if (paramPair[0] == "--blu-ray" || paramPair[0] == "--blu-ray-v3" || paramPair[0] == "--avchd")
        {
            m_bluRayMode = true;
        }
        else if (paramPair[0] == "--demux")
        {
            m_demuxMode = true;
        }
        else if (paramPair[0] == "--constant-iso-hdr")
        {
            m_reproducibleIsoHeader = true;
        }
    }
}